

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall
chrono::ChBody::ContactForceLoadResidual_F
          (ChBody *this,ChVector<double> *F,ChVector<double> *abs_point,ChVectorDynamic<> *R)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChVector<double> *local_c8 [2];
  ChVector<double> result;
  ChVector<double> force1_loc;
  ChVector<double> m_p1_loc;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_68 [56];
  
  ChFrame<double>::TransformParentToLocal
            (&m_p1_loc,(ChFrame<double> *)&this->super_ChBodyFrame,abs_point);
  Dir_World2Body(&force1_loc,this,F);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = m_p1_loc.m_data[0];
  auVar6._8_8_ = m_p1_loc.m_data[2];
  auVar6._0_8_ = m_p1_loc.m_data[2];
  auVar2._8_8_ = m_p1_loc.m_data[2];
  auVar2._0_8_ = m_p1_loc.m_data[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = force1_loc.m_data[0];
  auVar8._8_8_ = force1_loc.m_data[2];
  auVar8._0_8_ = force1_loc.m_data[2];
  auVar1._8_8_ = force1_loc.m_data[2];
  auVar1._0_8_ = force1_loc.m_data[1];
  auVar4 = vunpcklpd_avx(auVar6,auVar5);
  auVar3 = vunpcklpd_avx(auVar8,auVar3);
  auVar7._0_8_ = force1_loc.m_data[1] * auVar4._0_8_;
  auVar7._8_8_ = force1_loc.m_data[2] * auVar4._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = force1_loc.m_data[0] * m_p1_loc.m_data[1];
  auVar4 = vfmsub231sd_fma(auVar4,auVar5,auVar1);
  result.m_data._0_16_ = vfmsub213pd_fma(auVar3,auVar2,auVar7);
  result.m_data[2] = auVar4._0_8_;
  local_c8[0] = F;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,R,
             (ulong)(this->super_ChPhysicsItem).offset_w,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            (local_68,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)local_c8);
  local_c8[0] = &result;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,R,
             (ulong)((this->super_ChPhysicsItem).offset_w + 3),3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            (local_68,(MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)local_c8);
  return;
}

Assistant:

void ChBody::ContactForceLoadResidual_F(const ChVector<>& F, const ChVector<>& abs_point, ChVectorDynamic<>& R) {
    ChVector<> m_p1_loc = this->Point_World2Body(abs_point);
    ChVector<> force1_loc = this->Dir_World2Body(F);
    ChVector<> torque1_loc = Vcross(m_p1_loc, force1_loc);
    R.segment(this->GetOffset_w() + 0, 3) += F.eigen();
    R.segment(this->GetOffset_w() + 3, 3) += torque1_loc.eigen();
}